

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O0

void __thiscall Assimp::ValidateDSProcess::Validate(ValidateDSProcess *this,aiAnimation *pAnimation)

{
  uint local_20;
  uint local_1c;
  uint i_1;
  uint i;
  aiAnimation *pAnimation_local;
  ValidateDSProcess *this_local;
  
  Validate(this,&pAnimation->mName);
  if ((pAnimation->mNumChannels == 0) && (pAnimation->mNumMorphMeshChannels == 0)) {
    ReportError(this,
                "aiAnimation::mNumChannels is 0. At least one node animation channel must be there."
               );
  }
  if ((pAnimation->mChannels == (aiNodeAnim **)0x0) && (pAnimation->mNumChannels != 0)) {
    ReportError(this,"aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                (ulong)pAnimation->mNumChannels);
  }
  if ((pAnimation->mMorphMeshChannels == (aiMeshMorphAnim **)0x0) &&
     (pAnimation->mNumMorphMeshChannels != 0)) {
    ReportError(this,
                "aiAnimation::mMorphMeshChannels is NULL (aiAnimation::mNumMorphMeshChannels is %i)"
                ,(ulong)pAnimation->mNumMorphMeshChannels);
  }
  local_1c = 0;
  while( true ) {
    if (pAnimation->mNumChannels <= local_1c) {
      local_20 = 0;
      while( true ) {
        if (pAnimation->mNumMorphMeshChannels <= local_20) {
          return;
        }
        if (pAnimation->mMorphMeshChannels[local_20] == (aiMeshMorphAnim *)0x0) break;
        Validate(this,pAnimation,pAnimation->mMorphMeshChannels[local_20]);
        local_20 = local_20 + 1;
      }
      ReportError(this,
                  "aiAnimation::mMorphMeshChannels[%i] is NULL (aiAnimation::mNumMorphMeshChannels is %i)"
                  ,(ulong)local_20,(ulong)pAnimation->mNumMorphMeshChannels);
    }
    if (pAnimation->mChannels[local_1c] == (aiNodeAnim *)0x0) break;
    Validate(this,pAnimation,pAnimation->mChannels[local_1c]);
    local_1c = local_1c + 1;
  }
  ReportError(this,"aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
              (ulong)local_1c,(ulong)pAnimation->mNumChannels);
}

Assistant:

void ValidateDSProcess::Validate( const aiAnimation* pAnimation)
{
    Validate(&pAnimation->mName);

    // validate all animations
    if (pAnimation->mNumChannels || pAnimation->mNumMorphMeshChannels)
    {
        if (!pAnimation->mChannels && pAnimation->mNumChannels) {
            ReportError("aiAnimation::mChannels is NULL (aiAnimation::mNumChannels is %i)",
                pAnimation->mNumChannels);
        }
        if (!pAnimation->mMorphMeshChannels && pAnimation->mNumMorphMeshChannels) {
            ReportError("aiAnimation::mMorphMeshChannels is NULL (aiAnimation::mNumMorphMeshChannels is %i)",
                pAnimation->mNumMorphMeshChannels);
        }
        for (unsigned int i = 0; i < pAnimation->mNumChannels;++i)
        {
            if (!pAnimation->mChannels[i])
            {
                ReportError("aiAnimation::mChannels[%i] is NULL (aiAnimation::mNumChannels is %i)",
                    i, pAnimation->mNumChannels);
            }
            Validate(pAnimation, pAnimation->mChannels[i]);
        }
        for (unsigned int i = 0; i < pAnimation->mNumMorphMeshChannels;++i)
        {
            if (!pAnimation->mMorphMeshChannels[i])
            {
                ReportError("aiAnimation::mMorphMeshChannels[%i] is NULL (aiAnimation::mNumMorphMeshChannels is %i)",
                    i, pAnimation->mNumMorphMeshChannels);
            }
            Validate(pAnimation, pAnimation->mMorphMeshChannels[i]);
        }
    }
    else {
    	ReportError("aiAnimation::mNumChannels is 0. At least one node animation channel must be there.");
    }
}